

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

int utf8_decode(char *src,int *size)

{
  byte bVar1;
  uint uVar2;
  int c3;
  int c2;
  int c1;
  int r;
  int c;
  int *size_local;
  char *src_local;
  
  bVar1 = *src;
  src_local._4_4_ = (uint)bVar1;
  *size = 1;
  if ((bVar1 & 0x80) != 0) {
    uVar2 = (uint)(byte)src[1];
    if ((src_local._4_4_ & 0xe0) == 0xc0) {
      src_local._4_4_ = (src_local._4_4_ & 0x1f) << 6 | uVar2;
      if (src_local._4_4_ < 0x80) {
        src_local._4_4_ = 0xffffffff;
      }
      else {
        *size = 2;
      }
    }
    else if ((src_local._4_4_ & 0xf0) == 0xe0) {
      src_local._4_4_ = (src_local._4_4_ & 0xf) << 0xc | uVar2 << 6 | (uint)(byte)src[2];
      if ((src_local._4_4_ < 0x800) || ((0xd7ff < src_local._4_4_ && (src_local._4_4_ < 0xe000)))) {
        src_local._4_4_ = 0xffffffff;
      }
      else {
        *size = 3;
      }
    }
    else if ((((src_local._4_4_ & 0xf8) == 0xf0) &&
             (src_local._4_4_ =
                   (src_local._4_4_ & 7) << 0x12 | uVar2 << 0xc | (uint)(byte)src[2] << 6 |
                   (uint)(byte)src[3], 0xffff < src_local._4_4_)) && (src_local._4_4_ < 0x110000)) {
      *size = 4;
    }
    else {
      src_local._4_4_ = 0xffffffff;
    }
  }
  return src_local._4_4_;
}

Assistant:

int utf8_decode(const char *src, int *size) 
{
	int c = src[0] & 255;
	int r;

	*size = 1;
	if ((c & 0x80) == 0)
	{
		return c;
	}

	int c1 = src[1] & 255;

	if ((c & 0xE0) == 0xC0) 
	{
		r = ((c & 0x1F) << 6) | c1;
		if (r >= 128) 
		{
			*size = 2;
			return r;
		}
		return -1;
	}

	int c2 = src[2] & 255;

	if ((c & 0xF0) == 0xE0) 
	{
		r = ((c & 0x0F) << 12) | (c1 << 6) | c2;
		if (r >= 2048 && (r < 55296 || r > 57343)) 
		{
			*size = 3;
			return r;
		}
		return -1;
	}
	
	int c3 = src[3] & 255;

	if ((c & 0xF8) == 0xF0) 
	{
		r = ((c & 0x07) << 18) | (c1 << 12) | (c2 << 6) | c3;
		if (r >= 65536 && r <= 1114111) 
		{
			*size = 4;
			return r;
		}
	}
	return -1;
}